

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageIO.cpp
# Opt level: O0

Image * Imf_3_4::loadImage(string *fileName,Header *hdr)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  ArgExc *pAVar6;
  string *psVar7;
  string *in_RDI;
  FlatImage *fimg;
  DeepImage *dimg;
  Image *img;
  MultiPartInputFile mpi;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  bool multiPart;
  bool deep;
  bool tiled;
  MultiPartInputFile *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc40;
  byte bVar8;
  Image *local_360;
  MultiPartInputFile local_358 [32];
  stringstream local_338 [16];
  ostream local_328 [152];
  DeepImage *in_stack_fffffffffffffd70;
  Header *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  FlatImage *in_stack_fffffffffffffe00;
  Header *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  stringstream local_1a0 [16];
  ostream local_190 [64];
  DeepImage *in_stack_fffffffffffffeb0;
  Header *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  bool local_13;
  bool local_12;
  bool local_11 [9];
  string *local_8;
  
  local_8 = in_RDI;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  uVar4 = Imf_3_4::isOpenExrFile(pcVar3,local_11,&local_12,&local_13);
  if ((uVar4 & 1) == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar5 = std::operator<<(local_190,"Cannot load image file ");
    poVar5 = std::operator<<(poVar5,local_8);
    std::operator<<(poVar5,".  The file is not an OpenEXR file.");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,local_1a0);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if ((local_13 & 1U) == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_358,pcVar3,iVar2,true);
    iVar2 = Imf_3_4::MultiPartInputFile::parts();
    bVar8 = 0;
    if (0 < iVar2) {
      Imf_3_4::MultiPartInputFile::header((int)local_358);
      bVar1 = Imf_3_4::Header::hasType();
      bVar8 = 0;
      if ((bVar1 & 1) != 0) {
        Imf_3_4::MultiPartInputFile::header((int)local_358);
        psVar7 = (string *)Imf_3_4::Header::type_abi_cxx11_();
        bVar8 = Imf_3_4::isTiled(psVar7);
      }
    }
    local_11[0] = (bool)(bVar8 & 1);
    MultiPartInputFile::~MultiPartInputFile(in_stack_fffffffffffffc00);
    if ((local_12 & 1U) == 0) {
      local_360 = (Image *)operator_new(0x68);
      FlatImage::FlatImage((FlatImage *)CONCAT17(bVar8,in_stack_fffffffffffffc40));
      if ((local_11[0] & 1U) == 0) {
        loadFlatScanLineImage
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      }
      else {
        loadFlatTiledImage(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                           (FlatImage *)in_stack_fffffffffffffd70);
      }
    }
    else {
      local_360 = (Image *)operator_new(0x68);
      DeepImage::DeepImage((DeepImage *)CONCAT17(bVar8,in_stack_fffffffffffffc40));
      if ((local_11[0] & 1U) == 0) {
        loadDeepScanLineImage
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      }
      else {
        loadDeepTiledImage(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                           in_stack_fffffffffffffd70);
      }
    }
    return local_360;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_338);
  poVar5 = std::operator<<(local_328,"Cannot load image file ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::operator<<(poVar5,".  Multi-part file loading is not supported.");
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar6,local_338);
  __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

Image*
loadImage (const string& fileName, Header& hdr)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str (), tiled, deep, multiPart))
    {
        THROW (
            ArgExc,
            "Cannot load image file " << fileName
                                      << ".  "
                                         "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (
            ArgExc,
            "Cannot load image file "
                << fileName
                << ".  "
                   "Multi-part file loading is not supported.");
    }

    //XXX TODO: the tiled flag obtained above is unreliable;
    // open the file as a multi-part file and inspect the header.
    // Can the OpenEXR library be fixed?

    {
        MultiPartInputFile mpi (fileName.c_str ());

        tiled =
            (mpi.parts () > 0 && mpi.header (0).hasType () &&
             isTiled (mpi.header (0).type ()));
    }

    Image* img = 0;

    try
    {
        if (deep)
        {
            DeepImage* dimg = new DeepImage;
            img             = dimg;

            if (tiled)
                loadDeepTiledImage (fileName, hdr, *dimg);
            else
                loadDeepScanLineImage (fileName, hdr, *dimg);
        }
        else
        {
            FlatImage* fimg = new FlatImage;
            img             = fimg;

            if (tiled)
                loadFlatTiledImage (fileName, hdr, *fimg);
            else
                loadFlatScanLineImage (fileName, hdr, *fimg);
        }
    }
    catch (...)
    {
        delete img;
        throw;
    }

    return img;
}